

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_stats.cpp
# Opt level: O1

int __thiscall libtorrent::find_metric_idx(libtorrent *this,string_view name)

{
  bool bVar1;
  int iVar2;
  undefined **ppuVar3;
  ulong uVar4;
  undefined **__it;
  libtorrent *local_30;
  size_t local_28;
  
  local_28 = name._M_len;
  __it = &(anonymous_namespace)::metrics;
  uVar4 = 0x49;
  local_30 = this;
  do {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_30,(stats_metric_impl *)__it);
    ppuVar3 = __it;
    if (bVar1) goto LAB_002ffbef;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_30,(stats_metric_impl *)((long)__it + 0x10));
    ppuVar3 = (undefined **)((long)__it + 0x10);
    if (bVar1) goto LAB_002ffbef;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_30,(stats_metric_impl *)((long)__it + 0x20));
    ppuVar3 = (undefined **)((long)__it + 0x20);
    if (bVar1) goto LAB_002ffbef;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_30,(stats_metric_impl *)((long)__it + 0x30));
    ppuVar3 = (undefined **)((long)__it + 0x30);
    if (bVar1) goto LAB_002ffbef;
    __it = (undefined **)((long)__it + 0x40);
    uVar4 = uVar4 - 1;
  } while (1 < uVar4);
  bVar1 = __gnu_cxx::__ops::
          _Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::$_0>
          ::operator()((_Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::__0>
                        *)&local_30,(stats_metric_impl *)&PTR_anon_var_dwarf_e939ba_004f5018);
  ppuVar3 = &PTR_anon_var_dwarf_e939ba_004f5018;
  if (!bVar1) {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_30,(stats_metric_impl *)&PTR_anon_var_dwarf_e939c6_004f5028);
    ppuVar3 = &PTR_anon_var_dwarf_e939c6_004f5028;
    if (!bVar1) {
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::$_0>
              ::operator()((_Iter_pred<libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::__0>
                            *)&local_30,(stats_metric_impl *)&PTR_anon_var_dwarf_e939d2_004f5038);
      ppuVar3 = (undefined **)&settings_pack::vtable;
      if (bVar1) {
        ppuVar3 = &PTR_anon_var_dwarf_e939d2_004f5038;
      }
    }
  }
LAB_002ffbef:
  if ((stats_metric_impl *)ppuVar3 == (stats_metric_impl *)&settings_pack::vtable) {
    iVar2 = -1;
  }
  else {
    iVar2 = ((stats_metric_impl *)ppuVar3)->value_index;
  }
  return iVar2;
}

Assistant:

int find_metric_idx(string_view name)
	{
		auto const i = std::find_if(std::begin(metrics), std::end(metrics)
			, [name](stats_metric_impl const& metr)
			{ return metr.name == name; });

		if (i == std::end(metrics)) return -1;
		return i->value_index;
	}